

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimationNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  Node *pNVar1;
  undefined8 uVar2;
  runtime_error *this_00;
  long *plVar3;
  size_type *psVar4;
  long *in_RDX;
  ulong uVar5;
  Ref<embree::SceneGraph::Node> nodei;
  Ref<embree::SceneGraph::Node> local_88;
  Ref<embree::SceneGraph::Node> local_80;
  Ref<embree::SceneGraph::Node> local_78;
  undefined1 local_70 [64];
  
  if (*(long *)(*in_RDX + 0x88) != *(long *)(*in_RDX + 0x80)) {
    loadNode(this,xml);
    if (8 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80))) {
      pNVar1 = (Node *)(this->path).filename._M_dataplus._M_p;
      uVar5 = 1;
      do {
        loadNode((XMLLoader *)local_70,xml);
        local_78.ptr = pNVar1;
        if (pNVar1 != (Node *)0x0) {
          (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
        }
        uVar2 = local_70._0_8_;
        local_80.ptr = (Node *)local_70._0_8_;
        if ((long *)local_70._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_70._0_8_ + 0x10))(local_70._0_8_);
        }
        SceneGraph::extend_animation(&local_78,&local_80);
        if (local_80.ptr != (Node *)0x0) {
          (*((local_80.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        if (local_78.ptr != (Node *)0x0) {
          (*((local_78.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        if ((long *)uVar2 != (long *)0x0) {
          (**(code **)(*(long *)uVar2 + 0x18))(uVar2);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3));
    }
    local_88.ptr = (Node *)(this->path).filename._M_dataplus._M_p;
    if (local_88.ptr != (Node *)0x0) {
      (*((local_88.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    SceneGraph::optimize_animation(&local_88);
    if (local_88.ptr != (Node *)0x0) {
      (*((local_88.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)(local_70 + 0x20),(ParseLocation *)(*in_RDX + 0x10));
  plVar3 = (long *)std::__cxx11::string::append(local_70 + 0x20);
  local_70._0_8_ = *plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_70._0_8_ == psVar4) {
    local_70._16_8_ = *psVar4;
    local_70._24_8_ = plVar3[3];
    local_70._0_8_ = local_70 + 0x10;
  }
  else {
    local_70._16_8_ = *psVar4;
  }
  local_70._8_8_ = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)local_70);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimationNode(const Ref<XML>& xml) 
  {
    if (xml->size() == 0) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Animation node");
    Ref<SceneGraph::Node> node = loadNode(xml->children[0]);
    for (size_t i=1; i<xml->size(); i++) {
      Ref<SceneGraph::Node> nodei = loadNode(xml->children[i]);
      SceneGraph::extend_animation(node,nodei);
    }
    SceneGraph::optimize_animation(node);
    return node;
  }